

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O3

void __thiscall
Assimp::OptimizeGraphProcess::FindInstancedMeshes(OptimizeGraphProcess *this,aiNode *pNode)

{
  pointer puVar1;
  ulong uVar2;
  
  if (pNode->mNumMeshes != 0) {
    uVar2 = 0;
    do {
      puVar1 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + pNode->mMeshes[uVar2];
      *puVar1 = *puVar1 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar2 = 0;
    do {
      FindInstancedMeshes(this,pNode->mChildren[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void OptimizeGraphProcess::FindInstancedMeshes(aiNode *pNode) {
	for (unsigned int i = 0; i < pNode->mNumMeshes; ++i) {
		++meshes[pNode->mMeshes[i]];
	}

	for (unsigned int i = 0; i < pNode->mNumChildren; ++i)
		FindInstancedMeshes(pNode->mChildren[i]);
}